

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::rearrange(QMdiAreaPrivate *this,Rearranger *rearranger)

{
  ulong uVar1;
  QList<QMdi::Rearranger_*> *this_00;
  uint uVar2;
  QWidget *this_01;
  QWidgetData *pQVar3;
  Representation RVar4;
  undefined1 auVar5 [16];
  long lVar6;
  QMdiSubWindow **ppQVar7;
  bool bVar8;
  int iVar9;
  QSize QVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  Representation RVar14;
  long in_FS_OFFSET;
  int local_ac;
  QSize local_a8;
  QSize local_a0;
  QRect local_90;
  QSize local_80;
  QList<QMdiSubWindow_*> local_78;
  QArrayData *local_58;
  undefined8 uStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (rearranger != (Rearranger *)0x0) {
    if ((*(byte *)(*(long *)(*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                       super_QWidgetPrivate.field_0x8 + 0x20) + 9) & 0x80) == 0) {
      this_00 = &this->pendingRearrangements;
      lVar13 = (this->pendingRearrangements).d.size;
      if (lVar13 != 0) {
        lVar11 = -0x100000000;
        uVar12 = 0xfffffffffffffff8;
        do {
          if (lVar13 * -8 + uVar12 == -8) goto LAB_004403c2;
          lVar11 = lVar11 + 0x100000000;
          uVar1 = uVar12 + 8;
          lVar6 = uVar12 + 8;
          uVar12 = uVar1;
        } while (*(Rearranger **)((long)(this->pendingRearrangements).d.ptr + lVar6) != rearranger);
        if ((int)(~uVar1 >> 3) != 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QList<QMdi::Rearranger_*>::move(this_00,lVar11 >> 0x20,lVar13 + -1);
            return;
          }
          goto LAB_00440722;
        }
      }
LAB_004403c2:
      local_58 = (QArrayData *)rearranger;
      QtPrivate::QPodArrayOps<QMdi::Rearranger*>::emplace<QMdi::Rearranger*&>
                ((QPodArrayOps<QMdi::Rearranger*> *)this_00,lVar13,(Rearranger **)&local_58);
      QList<QMdi::Rearranger_*>::end(this_00);
    }
    else {
      local_58 = (QArrayData *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      iVar9 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
      subWindowList(&local_78,this,this->activationOrder,iVar9 == 0);
      ppQVar7 = local_78.d.ptr;
      local_80.wd.m_i = -1;
      local_80.ht.m_i = -1;
      if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
        local_a8.wd.m_i = -1;
        local_a8.ht.m_i = -1;
        lVar13 = local_78.d.size << 3;
        local_ac = -1;
        lVar11 = 0;
        local_a0.wd.m_i = -1;
        local_a0.ht.m_i = 0;
        do {
          this_01 = *(QWidget **)((long)ppQVar7 + lVar11);
          bVar8 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::rearrange");
          if ((bVar8) && ((this_01->data->widget_attributes & 0x8000) != 0)) {
            iVar9 = (*rearranger->_vptr_Rearranger[1])(rearranger);
            bVar8 = QWidget::isMinimized(this_01);
            if (iVar9 == 2) {
              if ((bVar8) && (bVar8 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_01), !bVar8)) {
                local_90._0_8_ = this_01;
                QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                          ((QPodArrayOps<QWidget*> *)&local_58,local_48,(QWidget **)&local_90);
                QList<QWidget_*>::end((QList<QWidget_*> *)&local_58);
              }
            }
            else if ((!bVar8) || (bVar8 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_01), bVar8))
            {
              bVar8 = QWidget::isMaximized(this_01);
              if ((bVar8) || (bVar8 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_01), bVar8)) {
                QWidget::showNormal(this_01);
              }
              QVar10 = QWidget::minimumSize(this_01);
              if (local_a0.wd.m_i.m_i <= QVar10.wd.m_i.m_i) {
                local_a0 = QVar10;
              }
              RVar14.m_i = QVar10.ht.m_i.m_i;
              if (QVar10.ht.m_i.m_i < local_ac) {
                RVar14.m_i = local_ac;
              }
              uVar2 = *(uint *)(*(long *)&this_01->field_0x8 + 0x2b8);
              iVar9 = *(int *)(*(long *)&this_01->field_0x8 + 700);
              RVar4.m_i = local_a0.wd.m_i.m_i;
              if (local_a0.wd.m_i.m_i <= (int)uVar2) {
                RVar4.m_i = uVar2;
              }
              local_a0.ht.m_i = 0;
              local_a0.wd.m_i = RVar4.m_i;
              local_ac = RVar14.m_i;
              if (RVar14.m_i <= iVar9) {
                local_ac = iVar9;
              }
              local_a8.ht.m_i = local_ac;
              local_a8.wd.m_i = RVar4.m_i;
              local_90._0_8_ = this_01;
              QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                        ((QPodArrayOps<QWidget*> *)&local_58,local_48,(QWidget **)&local_90);
              QList<QWidget_*>::end((QList<QWidget_*> *)&local_58);
            }
          }
          lVar11 = lVar11 + 8;
        } while (lVar13 != lVar11);
        local_80 = local_a8;
      }
      pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      auVar5._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
      auVar5._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
      auVar5._8_8_ = 0;
      local_90 = (QRect)(auVar5 << 0x40);
      iVar9 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      if ((iVar9 == 0) && (local_48 != 0)) {
        local_90 = resizeToMinimumTileSize(this,&local_80,(int)local_48);
      }
      (**rearranger->_vptr_Rearranger)(rearranger,&local_58,&local_90);
      iVar9 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      if ((iVar9 == 0) && (local_48 != 0)) {
        this->isSubWindowsTiled = true;
        updateScrollBars(this);
      }
      else {
        iVar9 = (*rearranger->_vptr_Rearranger[1])(rearranger);
        if (iVar9 == 1) {
          this->isSubWindowsTiled = false;
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
        }
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00440722:
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::rearrange(Rearranger *rearranger)
{
    if (!rearranger)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // Compress if we already have the rearranger in the list.
        int index = pendingRearrangements.indexOf(rearranger);
        if (index != -1)
            pendingRearrangements.move(index, pendingRearrangements.size() - 1);
        else
            pendingRearrangements.append(rearranger);
        return;
    }

    QList<QWidget *> widgets;
    const bool reverseList = rearranger->type() == Rearranger::RegularTiler;
    const QList<QMdiSubWindow *> subWindows = subWindowList(activationOrder, reverseList);
    QSize minSubWindowSize;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::rearrange") || !child->isVisible())
            continue;
        if (rearranger->type() == Rearranger::IconTiler) {
            if (child->isMinimized() && !child->isShaded())
                widgets.append(child);
        } else {
            if (child->isMinimized() && !child->isShaded())
                continue;
            if (child->isMaximized() || child->isShaded())
                child->showNormal();
            minSubWindowSize = minSubWindowSize.expandedTo(child->minimumSize())
                               .expandedTo(child->d_func()->internalMinimumSize);
            widgets.append(child);
        }
    }

    QRect domain = viewport->rect();
    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty())
        domain = resizeToMinimumTileSize(minSubWindowSize, widgets.size());

    rearranger->rearrange(widgets, domain);

    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty()) {
        isSubWindowsTiled = true;
        updateScrollBars();
    } else if (rearranger->type() == Rearranger::SimpleCascader) {
        isSubWindowsTiled = false;
    }
}